

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O2

int lws_plat_if_up(char *ifname,int fd,int up)

{
  int iVar1;
  char *format;
  ifreq ifr;
  
  ifr.ifr_ifru.ifru_map.mem_start = 0;
  ifr.ifr_ifru.ifru_map.mem_end = 0;
  ifr.ifr_ifrn._0_8_ = 0;
  ifr.ifr_ifrn._8_8_ = 0;
  ifr.ifr_ifru._16_8_ = 0;
  lws_strncpy((char *)&ifr,ifname,0x10);
  iVar1 = ioctl(fd,0x8913,&ifr);
  if (iVar1 < 0) {
    format = "%s: SIOCGIFFLAGS fail\n";
  }
  else {
    ifr.ifr_ifru.ifru_addr.sa_family =
         (ushort)(up != 0) | (ushort)ifr.ifr_ifru.ifru_map.mem_start & 0xfffe;
    iVar1 = ioctl(fd,0x8914);
    if (-1 < iVar1) {
      return 0;
    }
    format = "%s: SIOCSIFFLAGS fail\n";
  }
  _lws_log(1,format,"lws_plat_if_up");
  return 1;
}

Assistant:

int
lws_plat_if_up(const char *ifname, int fd, int up)
{
#if defined(__linux__)
	struct ifreq ifr;

	memset(&ifr, 0, sizeof(ifr));
	lws_strncpy(ifr.ifr_name, ifname, IFNAMSIZ);

	if (ioctl(fd, SIOCGIFFLAGS, &ifr) < 0) {
		lwsl_err("%s: SIOCGIFFLAGS fail\n", __func__);
		return 1;
	}

	if (up)
		ifr.ifr_flags |= IFF_UP;
	else
		ifr.ifr_flags &= ~IFF_UP;

	if (ioctl(fd, SIOCSIFFLAGS, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFFLAGS fail\n", __func__);
		return 1;
	}

	return 0;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}